

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

void ZydisSetEffectiveAddressWidth
               (ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,
               ZydisInstructionDefinition *definition)

{
  byte local_21;
  ZyanU8 index;
  ZydisInstructionDefinition *definition_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  
  if (context == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xd9e,
                  "void ZydisSetEffectiveAddressWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  if (instruction != (ZydisDecodedInstruction *)0x0) {
    local_21 = (instruction->attributes & 0x100000000000) != 0;
    if ((instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_32) ||
       (instruction->machine_mode == ZYDIS_MACHINE_MODE_LEGACY_32)) {
      local_21 = local_21 + 2;
    }
    else if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
      local_21 = local_21 + 4;
    }
    if (((byte)(*(ulong *)definition >> 0x24) & 3) < 3) {
      if (local_21 < 8) {
        instruction->address_width =
             ZydisSetEffectiveAddressWidth::address_size_map
             [(byte)(*(ulong *)definition >> 0x24) & 3][local_21];
        context->easz_index = (ZyanU8)((int)(uint)instruction->address_width >> 5);
        return;
      }
      __assert_fail("index < (sizeof(address_size_map[definition->address_size_map]) / sizeof((address_size_map[definition->address_size_map])[0]))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xdcd,
                    "void ZydisSetEffectiveAddressWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    __assert_fail("definition->address_size_map < (sizeof(address_size_map) / sizeof((address_size_map)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xdcc,
                  "void ZydisSetEffectiveAddressWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  __assert_fail("instruction",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0xd9f,
                "void ZydisSetEffectiveAddressWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
               );
}

Assistant:

static void ZydisSetEffectiveAddressWidth(ZydisDecoderContext* context,
    ZydisDecodedInstruction* instruction, const ZydisInstructionDefinition* definition)
{
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(instruction);

    static const ZyanU8 address_size_map[3][8] =
    {
        // Default for most instructions
        {
            16, // 16 __
            32, // 16 67
            32, // 32 __
            16, // 32 67
            64, // 64 __
            32  // 64 67
        },
        // The address-size override is ignored
        {
            16, // 16 __
            16, // 16 67
            32, // 32 __
            32, // 32 67
            64, // 64 __
            64  // 64 67
        },
        // The address-size is forced to 64-bit in 64-bit mode and 32-bit in non 64-bit mode. This
        // is used by e.g. `ENCLS`, `ENCLV`, `ENCLU`.
        {
            32, // 16 __
            32, // 16 67
            32, // 32 __
            32, // 32 67
            64, // 64 __
            64  // 64 67
        }
    };

    ZyanU8 index = (instruction->attributes & ZYDIS_ATTRIB_HAS_ADDRESSSIZE) ? 1 : 0;
    if ((instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_32) ||
        (instruction->machine_mode == ZYDIS_MACHINE_MODE_LEGACY_32))
    {
        index += 2;
    }
    else if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)
    {
        index += 4;
    }

    ZYAN_ASSERT(definition->address_size_map < ZYAN_ARRAY_LENGTH(address_size_map));
    ZYAN_ASSERT(index < ZYAN_ARRAY_LENGTH(address_size_map[definition->address_size_map]));

    instruction->address_width = address_size_map[definition->address_size_map][index];
    context->easz_index = instruction->address_width >> 5;
}